

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O3

bool tinyusdz::is_valid_utf8(string *str)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  
  if (str->_M_string_length != 0) {
    uVar2 = 0;
    do {
      bVar1 = (str->_M_dataplus)._M_p[uVar2];
      lVar3 = 1;
      if ((char)bVar1 < '\0') {
        lVar3 = 2;
        if ((((bVar1 & 0xe0) != 0xc0) && (lVar3 = 3, (bVar1 & 0xf0) != 0xe0)) &&
           (lVar3 = 4, (bVar1 & 0xf8) != 0xf0)) {
          return false;
        }
      }
      uVar2 = uVar2 + lVar3;
    } while (uVar2 < str->_M_string_length);
  }
  return true;
}

Assistant:

bool is_valid_utf8(const std::string &str) {
  // TODO: Consider UTF-BOM?
  for (size_t i = 0; i < str.size();) {
    uint32_t len = detail::utf8_len(*reinterpret_cast<const unsigned char *>(&str[i]));
    if (len == 0) {
      return false;
    }
    i += len;
  }
  return true;
}